

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDropSchema(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *pBVar1;
  DropInfo info;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 local_90 [80];
  _Alloc_hider local_40;
  char local_30 [24];
  __uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_> local_18;
  
  DropInfo::DropInfo((DropInfo *)local_90);
  local_90[9] = 2;
  pBVar1 = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(pBVar1,0x65,"schema");
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[0x1a])(local_b0,pBVar1);
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[3])(pBVar1);
  ::std::__cxx11::string::operator=((string *)&local_40,(string *)local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (this->deserialize_only == false) {
    Catalog::DropEntry(this->catalog,this->context,(DropInfo *)local_90);
  }
  local_90._0_8_ = &PTR__DropInfo_024925d0;
  if ((__uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
      super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>
                          .super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl + 8))
              ();
  }
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>.
  super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl =
       (tuple<duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_>)0x0;
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  if ((undefined1 *)local_90._48_8_ != local_90 + 0x40) {
    operator_delete((void *)local_90._48_8_);
  }
  if ((undefined1 *)local_90._16_8_ != local_90 + 0x20) {
    operator_delete((void *)local_90._16_8_);
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDropSchema() {
	DropInfo info;

	info.type = CatalogType::SCHEMA_ENTRY;
	info.name = deserializer.ReadProperty<string>(101, "schema");
	if (DeserializeOnly()) {
		return;
	}

	catalog.DropEntry(context, info);
}